

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextformat.cpp
# Opt level: O2

void __thiscall QTextFormat::setObjectIndex(QTextFormat *this,int o)

{
  QTextFormatPrivate *pQVar1;
  long in_FS_OFFSET;
  QVariant local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d).d.ptr;
  if (o == -1) {
    if (pQVar1 != (QTextFormatPrivate *)0x0) {
      pQVar1 = QSharedDataPointer<QTextFormatPrivate>::operator->(&this->d);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        QTextFormatPrivate::clearProperty(pQVar1,0);
        return;
      }
      goto LAB_0048dfbe;
    }
  }
  else {
    if (pQVar1 == (QTextFormatPrivate *)0x0) {
      pQVar1 = (QTextFormatPrivate *)operator_new(0x40);
      QTextFormatPrivate::QTextFormatPrivate(pQVar1);
      QSharedDataPointer<QTextFormatPrivate>::reset(&this->d,pQVar1);
    }
    pQVar1 = QSharedDataPointer<QTextFormatPrivate>::operator->(&this->d);
    ::QVariant::QVariant(&local_40,o);
    QTextFormatPrivate::insertProperty(pQVar1,0,&local_40);
    ::QVariant::~QVariant(&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
LAB_0048dfbe:
  __stack_chk_fail();
}

Assistant:

void QTextFormat::setObjectIndex(int o)
{
    if (o == -1) {
        if (d.constData())
            d->clearProperty(ObjectIndex);
    } else {
        if (!d.constData())
            d = new QTextFormatPrivate;
        // ### type
        d->insertProperty(ObjectIndex, o);
    }
}